

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_pbio.c
# Opt level: O2

void * CMpbio_get_format_rep_callback
                 (void *format_ID,int format_ID_length,int host_IP,int host_port,void *app_context,
                 void *client_data)

{
  void *__s1;
  atom_t aVar1;
  int iVar2;
  uint condition;
  __pid_t _Var3;
  attr_list attrs;
  char *pcVar4;
  ulong uVar5;
  pthread_t pVar6;
  FILE *pFVar7;
  size_t __n;
  ulong uVar8;
  size_t sStack_b0;
  timespec ts;
  char *server_rep;
  timespec local_58;
  pbio_exchange_msg msg;
  
  attrs = CMint_create_attr_list
                    ((CManager)client_data,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm_pbio.c"
                     ,0xfc);
  iVar2 = CManager_locked((CManager)client_data);
  if (iVar2 == 0) {
    __assert_fail("CManager_locked(cm)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm_pbio.c"
                  ,0xfe,
                  "void *CMpbio_get_format_rep_callback(void *, int, int, int, void *, void *)");
  }
  pcVar4 = inet_ntoa((in_addr)host_IP);
  iVar2 = CMtrace_val[6];
  if (*(long *)((long)client_data + 0x120) == 0) {
    iVar2 = CMtrace_init((CManager)client_data,CMFormatVerbose);
  }
  if (iVar2 != 0) {
    if (CMtrace_PID != 0) {
      pFVar7 = *(FILE **)((long)client_data + 0x120);
      _Var3 = getpid();
      pVar6 = pthread_self();
      fprintf(pFVar7,"P%lxT%lx - ",(long)_Var3,pVar6);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf(*(FILE **)((long)client_data + 0x120),"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fprintf(*(FILE **)((long)client_data + 0x120),
            "CMpbio request for format from host %x, port %d\n",(ulong)(uint)host_IP,
            (ulong)(uint)host_port);
  }
  fflush(*(FILE **)((long)client_data + 0x120));
  pFVar7 = *(FILE **)((long)client_data + 0x120);
  if (pFVar7 == (FILE *)0x0) {
    iVar2 = CMtrace_init((CManager)client_data,CMFormatVerbose);
    if (iVar2 != 0) {
      pFVar7 = *(FILE **)((long)client_data + 0x120);
      goto LAB_00126684;
    }
  }
  else if (CMtrace_val[6] != 0) {
LAB_00126684:
    fwrite("CMpbio request is for format ",0x1d,1,pFVar7);
    fprint_server_ID(*(undefined8 *)((long)client_data + 0x120),format_ID);
    fputc(10,*(FILE **)((long)client_data + 0x120));
  }
  condition = INT_CMCondition_get((CManager)client_data,(CMConnection)app_context);
  INT_CMCondition_set_client_data((CManager)client_data,condition,&server_rep);
  uVar8 = 0;
  uVar5 = (ulong)*(uint *)((long)client_data + 0x58);
  if ((int)*(uint *)((long)client_data + 0x58) < 1) {
    uVar5 = uVar8;
  }
  for (; uVar5 * 0x18 - uVar8 != 0; uVar8 = uVar8 + 0x18) {
    __s1 = *(void **)(*(long *)((long)client_data + 0x60) + uVar8);
    if (((__s1 != (void *)0x0) &&
        (__n = (size_t)*(int *)(*(long *)((long)client_data + 0x60) + 8 + uVar8), __n != 0)) &&
       (iVar2 = bcmp(__s1,format_ID,__n), iVar2 == 0)) {
      add_request_to_pending((CManager)client_data,format_ID,format_ID_length,condition);
      iVar2 = CMtrace_val[6];
      if (*(long *)((long)client_data + 0x120) == 0) {
        iVar2 = CMtrace_init((CManager)client_data,CMFormatVerbose);
      }
      if (iVar2 != 0) {
        if (CMtrace_PID != 0) {
          pFVar7 = *(FILE **)((long)client_data + 0x120);
          _Var3 = getpid();
          pVar6 = pthread_self();
          fprintf(pFVar7,"P%lxT%lx - ",(long)_Var3,pVar6);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf(*(FILE **)((long)client_data + 0x120),"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        fwrite("CMpbio - add duplicate pending request\n",0x27,1,
               *(FILE **)((long)client_data + 0x120));
      }
      fflush(*(FILE **)((long)client_data + 0x120));
      goto LAB_00126cd4;
    }
  }
  add_request_to_pending((CManager)client_data,format_ID,format_ID_length,condition);
  if ((app_context == (void *)0x0) || (*(int *)((long)app_context + 0x28) != 0)) {
    iVar2 = CMtrace_val[6];
    if (*(long *)((long)client_data + 0x120) == 0) {
      iVar2 = CMtrace_init((CManager)client_data,CMFormatVerbose);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        pFVar7 = *(FILE **)((long)client_data + 0x120);
        _Var3 = getpid();
        pVar6 = pthread_self();
        fprintf(pFVar7,"P%lxT%lx - ",(long)_Var3,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf(*(FILE **)((long)client_data + 0x120),"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf(*(FILE **)((long)client_data + 0x120),
              "CMpbio connection not available, trying to reestablish, conn %p, host %s, port %d\n",
              app_context,pcVar4,(ulong)(uint)host_port);
    }
    fflush(*(FILE **)((long)client_data + 0x120));
    if (CMpbio_get_format_rep_callback::CM_IP_HOSTNAME == -1) {
      CMpbio_get_format_rep_callback::CM_IP_HOSTNAME = attr_atom_from_string("IP_HOST");
      CMpbio_get_format_rep_callback::CM_IP_PORT = attr_atom_from_string("IP_PORT");
    }
    aVar1 = CMpbio_get_format_rep_callback::CM_IP_HOSTNAME;
    pcVar4 = strdup(pcVar4);
    set_string_attr(attrs,aVar1,pcVar4);
    set_int_attr(attrs,CMpbio_get_format_rep_callback::CM_IP_PORT,host_port);
    app_context = CMinternal_get_conn((CManager_conflict)client_data,attrs);
    if ((CMConnection)app_context != (CMConnection)0x0) {
      iVar2 = CMtrace_val[6];
      if (*(long *)((long)client_data + 0x120) == 0) {
        iVar2 = CMtrace_init((CManager)client_data,CMFormatVerbose);
      }
      if (iVar2 != 0) {
        if (CMtrace_PID != 0) {
          pFVar7 = *(FILE **)((long)client_data + 0x120);
          _Var3 = getpid();
          pVar6 = pthread_self();
          fprintf(pFVar7,"P%lxT%lx - ",(long)_Var3,pVar6);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf(*(FILE **)((long)client_data + 0x120),"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        pFVar7 = *(FILE **)((long)client_data + 0x120);
        pcVar4 = "CMpbio got connection %p\n";
        goto LAB_00126b8e;
      }
      goto LAB_00126b98;
    }
    iVar2 = CMtrace_val[6];
    if (*(long *)((long)client_data + 0x120) == 0) {
      iVar2 = CMtrace_init((CManager)client_data,CMFormatVerbose);
    }
    if (iVar2 == 0) goto LAB_00127023;
    if (CMtrace_PID != 0) {
      pFVar7 = *(FILE **)((long)client_data + 0x120);
      _Var3 = getpid();
      pVar6 = pthread_self();
      fprintf(pFVar7,"P%lxT%lx - ",(long)_Var3,pVar6);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf(*(FILE **)((long)client_data + 0x120),"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    pFVar7 = *(FILE **)((long)client_data + 0x120);
    pcVar4 = "CMpbio failed to reestablish connection, returning NULL\n";
    sStack_b0 = 0x38;
  }
  else {
    *(int *)((long)app_context + 0x18) = *(int *)((long)app_context + 0x18) + 1;
    iVar2 = CMtrace_val[6];
    if (*(long *)((long)client_data + 0x120) == 0) {
      iVar2 = CMtrace_init((CManager)client_data,CMFormatVerbose);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        pFVar7 = *(FILE **)((long)client_data + 0x120);
        _Var3 = getpid();
        pVar6 = pthread_self();
        fprintf(pFVar7,"P%lxT%lx - ",(long)_Var3,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf(*(FILE **)((long)client_data + 0x120),"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      pFVar7 = *(FILE **)((long)client_data + 0x120);
      pcVar4 = "CMpbio Request format on connection %p\n";
LAB_00126b8e:
      fprintf(pFVar7,pcVar4,app_context);
    }
LAB_00126b98:
    fflush(*(FILE **)((long)client_data + 0x120));
    ts.tv_sec = (__time_t)&msg;
    msg.magic = 0x5042494f;
    msg.msg_len = format_ID_length + 0x10;
    msg.msg_type = 0;
    msg.payload2_length = 0;
    ts.tv_nsec = 0x18;
    msg.cond = condition;
    msg.payload1_length = format_ID_length;
    iVar2 = CMtrace_val[3];
    if (((CMConnection)app_context)->cm->CMTrace_file == (FILE *)0x0) {
      iVar2 = CMtrace_init(((CMConnection)app_context)->cm,CMLowLevelVerbose);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        pFVar7 = (FILE *)((CMConnection)app_context)->cm->CMTrace_file;
        _Var3 = getpid();
        pVar6 = pthread_self();
        fprintf(pFVar7,"P%lxT%lx - ",(long)_Var3,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_58);
        fprintf((FILE *)((CMConnection)app_context)->cm->CMTrace_file,"%lld.%.9ld - ",
                local_58.tv_sec,local_58.tv_nsec);
      }
      fprintf((FILE *)((CMConnection)app_context)->cm->CMTrace_file,
              "CMpbio send format request - total %d bytes in writev\n",
              (ulong)(format_ID_length + 0x18));
    }
    fflush((FILE *)((CMConnection)app_context)->cm->CMTrace_file);
    iVar2 = (*((CMConnection)app_context)->trans->writev_func)
                      (&CMstatic_trans_svcs,((CMConnection)app_context)->transport_data,&ts,2,
                       (attr_list)0x0);
    if (iVar2 == 2) {
LAB_00126cd4:
      iVar2 = CMtrace_val[6];
      if (*(long *)((long)client_data + 0x120) == 0) {
        iVar2 = CMtrace_init((CManager)client_data,CMFormatVerbose);
      }
      if (iVar2 != 0) {
        if (CMtrace_PID != 0) {
          pFVar7 = *(FILE **)((long)client_data + 0x120);
          _Var3 = getpid();
          pVar6 = pthread_self();
          fprintf(pFVar7,"P%lxT%lx - ",(long)_Var3,pVar6);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf(*(FILE **)((long)client_data + 0x120),"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        fprintf(*(FILE **)((long)client_data + 0x120),"CMpbio waiting on condition %d\n",
                (ulong)condition);
      }
      fflush(*(FILE **)((long)client_data + 0x120));
      IntCManager_unlock((CManager)client_data,
                         "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm_pbio.c"
                         ,0x136);
      iVar2 = INT_CMCondition_wait((CManager)client_data,condition);
      if (iVar2 == 1) {
        iVar2 = CMtrace_val[6];
        if (*(long *)((long)client_data + 0x120) == 0) {
          iVar2 = CMtrace_init((CManager)client_data,CMFormatVerbose);
        }
        if (iVar2 != 0) {
          if (CMtrace_PID != 0) {
            pFVar7 = *(FILE **)((long)client_data + 0x120);
            _Var3 = getpid();
            pVar6 = pthread_self();
            fprintf(pFVar7,"P%lxT%lx - ",(long)_Var3,pVar6);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&ts);
            fprintf(*(FILE **)((long)client_data + 0x120),"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
          }
          fwrite("CMpbio Request returned\n",0x18,1,*(FILE **)((long)client_data + 0x120));
        }
        fflush(*(FILE **)((long)client_data + 0x120));
        IntCManager_lock((CManager)client_data,
                         "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm_pbio.c"
                         ,0x13e);
        return server_rep;
      }
      iVar2 = CMtrace_val[6];
      if (*(long *)((long)client_data + 0x120) == 0) {
        iVar2 = CMtrace_init((CManager)client_data,CMFormatVerbose);
      }
      if (iVar2 != 0) {
        if (CMtrace_PID != 0) {
          pFVar7 = *(FILE **)((long)client_data + 0x120);
          _Var3 = getpid();
          pVar6 = pthread_self();
          fprintf(pFVar7,"P%lxT%lx - ",(long)_Var3,pVar6);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf(*(FILE **)((long)client_data + 0x120),"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        fprintf(*(FILE **)((long)client_data + 0x120),"CMpbio Connection failed %p\n",app_context);
      }
      goto LAB_00127023;
    }
    internal_connection_close((CMConnection)app_context);
    iVar2 = CMtrace_val[6];
    if (*(long *)((long)client_data + 0x120) == 0) {
      iVar2 = CMtrace_init((CManager)client_data,CMFormatVerbose);
    }
    if (iVar2 == 0) goto LAB_00127023;
    if (CMtrace_PID != 0) {
      pFVar7 = *(FILE **)((long)client_data + 0x120);
      _Var3 = getpid();
      pVar6 = pthread_self();
      fprintf(pFVar7,"P%lxT%lx - ",(long)_Var3,pVar6);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf(*(FILE **)((long)client_data + 0x120),"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    pFVar7 = *(FILE **)((long)client_data + 0x120);
    pcVar4 = "CMpbio write failed\n";
    sStack_b0 = 0x14;
  }
  fwrite(pcVar4,sStack_b0,1,pFVar7);
LAB_00127023:
  fflush(*(FILE **)((long)client_data + 0x120));
  return (void *)0x0;
}

Assistant:

extern void *
CMpbio_get_format_rep_callback(void *format_ID, int format_ID_length, 
			       int host_IP, int host_port, void *app_context,
			       void *client_data)
{
    CManager cm = (CManager) client_data;
    CMConnection conn = (CMConnection) app_context;
    char *server_rep;
    struct in_addr in;
    char *host_string;
    int cond;
    attr_list contact_attrs = CMcreate_attr_list(cm);

    assert(CManager_locked(cm));

    in.s_addr = host_IP;
    host_string =  inet_ntoa(in);
    CMtrace_out(cm, CMFormatVerbose, "CMpbio request for format from host %x, port %d\n", host_IP, host_port);
#ifndef MODULE
    if (CMtrace_on(cm, CMFormatVerbose)) {
	fprintf(cm->CMTrace_file, "CMpbio request is for format ");
	fprint_server_ID(cm->CMTrace_file, format_ID);
	fprintf(cm->CMTrace_file, "\n");
    }
#endif

    cond = INT_CMCondition_get(cm, conn);
    INT_CMCondition_set_client_data(cm, cond, &server_rep);

    if (request_in_pending(cm, format_ID, format_ID_length) == -1) {
        add_request_to_pending(cm, format_ID, format_ID_length, cond);
	if ((conn == NULL) || (conn->closed)) {
	    static atom_t CM_IP_HOSTNAME = -1;
	    static atom_t CM_IP_PORT = -1;
	    CMtrace_out(cm, CMFormatVerbose, 
			"CMpbio connection not available, trying to reestablish, conn %p, host %s, port %d\n", 
			conn, host_string, host_port);
	    if (CM_IP_HOSTNAME == -1) {
		CM_IP_HOSTNAME = attr_atom_from_string("IP_HOST");
		CM_IP_PORT = attr_atom_from_string("IP_PORT");
	    }
	    set_string_attr(contact_attrs, CM_IP_HOSTNAME, 
			    strdup(host_string));
	    set_int_attr(contact_attrs, CM_IP_PORT, host_port);
	    
	    conn = CMinternal_get_conn(cm, contact_attrs);
	
	    if (conn == NULL) {
		CMtrace_out(cm, CMFormatVerbose, "CMpbio failed to reestablish connection, returning NULL\n");
		return NULL;
	    }
	    CMtrace_out(cm, CMFormatVerbose, "CMpbio got connection %p\n", 
			conn);
	} else {
	    conn->conn_ref_count++;
	    CMtrace_out(cm, CMFormatVerbose, "CMpbio Request format on connection %p\n",
			conn);
	}
	if (CMpbio_send_format_request(format_ID, format_ID_length, conn,
				       cond) != 1) {
	    CMtrace_out(cm, CMFormatVerbose, "CMpbio write failed\n");
	    return NULL;
	}
    } else {
        add_request_to_pending(cm, format_ID, format_ID_length, cond);
	CMtrace_out(cm, CMFormatVerbose, 
		    "CMpbio - add duplicate pending request\n");
    }
    CMtrace_out(cm, CMFormatVerbose, "CMpbio waiting on condition %d\n", cond);
    CManager_unlock(cm);
    if (INT_CMCondition_wait(cm, cond) != 1) {
	CMtrace_out(cm, CMFormatVerbose, "CMpbio Connection failed %p\n",
		    conn);
	return NULL;
    } else {
	CMtrace_out(cm, CMFormatVerbose, "CMpbio Request returned\n");
    }
    CManager_lock(cm);
    return server_rep;
}